

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

void LZ4_memcpy_using_offset(BYTE *dstPtr,BYTE *srcPtr,BYTE *dstEnd,size_t offset)

{
  undefined2 local_30;
  undefined2 uStack_2e;
  undefined4 uStack_2c;
  BYTE v [8];
  size_t offset_local;
  BYTE *dstEnd_local;
  BYTE *srcPtr_local;
  BYTE *dstPtr_local;
  
  v = (BYTE  [8])offset;
  LZ4_write32(dstPtr,0);
  if (v == (BYTE  [8])0x1) {
    memset(&local_30,(uint)*srcPtr,8);
  }
  else if (v == (BYTE  [8])0x2) {
    local_30 = *(undefined2 *)srcPtr;
    uStack_2e = *(undefined2 *)srcPtr;
    uStack_2c = CONCAT22(uStack_2e,local_30);
  }
  else {
    if (v != (BYTE  [8])0x4) {
      LZ4_memcpy_using_offset_base(dstPtr,srcPtr,dstEnd,(size_t)v);
      return;
    }
    local_30 = (undefined2)*(undefined4 *)srcPtr;
    uStack_2e = (undefined2)((uint)*(undefined4 *)srcPtr >> 0x10);
    uStack_2c = *(undefined4 *)srcPtr;
  }
  *(ulong *)dstPtr = CONCAT44(uStack_2c,CONCAT22(uStack_2e,local_30));
  for (srcPtr_local = dstPtr + 8; srcPtr_local < dstEnd; srcPtr_local = srcPtr_local + 8) {
    *(ulong *)srcPtr_local = CONCAT44(uStack_2c,CONCAT22(uStack_2e,local_30));
  }
  return;
}

Assistant:

LZ4_FORCE_O2_INLINE_GCC_PPC64LE void
LZ4_memcpy_using_offset(BYTE* dstPtr, const BYTE* srcPtr, BYTE* dstEnd, const size_t offset)
{
    BYTE v[8];

    assert(dstEnd >= dstPtr + MINMATCH);
    LZ4_write32(dstPtr, 0);   /* silence an msan warning when offset==0 */

    switch(offset) {
    case 1:
        memset(v, *srcPtr, 8);
        break;
    case 2:
        memcpy(v, srcPtr, 2);
        memcpy(&v[2], srcPtr, 2);
        memcpy(&v[4], &v[0], 4);
        break;
    case 4:
        memcpy(v, srcPtr, 4);
        memcpy(&v[4], srcPtr, 4);
        break;
    default:
        LZ4_memcpy_using_offset_base(dstPtr, srcPtr, dstEnd, offset);
        return;
    }

    memcpy(dstPtr, v, 8);
    dstPtr += 8;
    while (dstPtr < dstEnd) {
        memcpy(dstPtr, v, 8);
        dstPtr += 8;
    }
}